

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2Replace(void)

{
  char *pcVar1;
  char *pattern;
  char *str;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  string all;
  string one;
  string local_200;
  string local_1e0;
  StringPiece local_1c0;
  undefined1 local_1b0 [384];
  
  for (piVar5 = &RE2Replace::tests[0].greplace_count; pcVar1 = *(char **)(piVar5 + -6),
      pcVar1 != (char *)0x0; piVar5 = piVar5 + 0xc) {
    std::__cxx11::string::string((string *)&local_1e0,pcVar1,(allocator *)local_1b0);
    pattern = ((ReplaceTest *)(piVar5 + -10))->regexp;
    RE2::RE2((RE2 *)local_1b0,pattern);
    str = *(char **)(piVar5 + -8);
    StringPiece::StringPiece((StringPiece *)&local_200,str);
    bVar2 = RE2::Replace(&local_1e0,(RE2 *)local_1b0,(StringPiece *)&local_200);
    RE2::~RE2((RE2 *)local_1b0);
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb4);
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Check failed: RE2::Replace(&one, t->regexp, t->rewrite)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    bVar2 = std::operator==(&local_1e0,*(char **)(piVar5 + -4));
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb5);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: (one) == (t->single)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    std::__cxx11::string::string((string *)&local_200,pcVar1,(allocator *)local_1b0);
    RE2::RE2((RE2 *)local_1b0,pattern);
    StringPiece::StringPiece(&local_1c0,str);
    iVar3 = RE2::GlobalReplace(&local_200,(RE2 *)local_1b0,&local_1c0);
    RE2::~RE2((RE2 *)local_1b0);
    if (iVar3 != *piVar5) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb7);
      poVar4 = std::operator<<((ostream *)(local_1b0 + 8),
                               "Check failed: (RE2::GlobalReplace(&all, t->regexp, t->rewrite)) == (t->greplace_count)"
                              );
      poVar4 = std::operator<<(poVar4,"Got: ");
      std::operator<<(poVar4,(string *)&local_200);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    bVar2 = std::operator==(&local_200,*(char **)(piVar5 + -2));
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb9);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: (all) == (t->global)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  return;
}

Assistant:

TEST(RE2, Replace) {
  VLOG(1) << "TestReplace";

  struct ReplaceTest {
    const char *regexp;
    const char *rewrite;
    const char *original;
    const char *single;
    const char *global;
    int        greplace_count;
  };
  static const ReplaceTest tests[] = {
    { "(qu|[b-df-hj-np-tv-z]*)([a-z]+)",
      "\\2\\1ay",
      "the quick brown fox jumps over the lazy dogs.",
      "ethay quick brown fox jumps over the lazy dogs.",
      "ethay ickquay ownbray oxfay umpsjay overay ethay azylay ogsday.",
      9 },
    { "\\w+",
      "\\0-NOSPAM",
      "abcd.efghi@google.com",
      "abcd-NOSPAM.efghi@google.com",
      "abcd-NOSPAM.efghi-NOSPAM@google-NOSPAM.com-NOSPAM",
      4 },
    { "^",
      "(START)",
      "foo",
      "(START)foo",
      "(START)foo",
      1 },
    { "^",
      "(START)",
      "",
      "(START)",
      "(START)",
      1 },
    { "$",
      "(END)",
      "",
      "(END)",
      "(END)",
      1 },
    { "b",
      "bb",
      "ababababab",
      "abbabababab",
      "abbabbabbabbabb",
      5 },
    { "b",
      "bb",
      "bbbbbb",
      "bbbbbbb",
      "bbbbbbbbbbbb",
      6 },
    { "b+",
      "bb",
      "bbbbbb",
      "bb",
      "bb",
      1 },
    { "b*",
      "bb",
      "bbbbbb",
      "bb",
      "bb",
      1 },
    { "b*",
      "bb",
      "aaaaa",
      "bbaaaaa",
      "bbabbabbabbabbabb",
      6 },
    // Check newline handling
    { "a.*a",
      "(\\0)",
      "aba\naba",
      "(aba)\naba",
      "(aba)\n(aba)",
      2 },
    { "", NULL, NULL, NULL, NULL, 0 }
  };

  for (const ReplaceTest* t = tests; t->original != NULL; t++) {
    VLOG(1) << StringPrintf("\"%s\" =~ s/%s/%s/g", t->original, t->regexp, t->rewrite);
    string one(t->original);
    CHECK(RE2::Replace(&one, t->regexp, t->rewrite));
    CHECK_EQ(one, t->single);
    string all(t->original);
    CHECK_EQ(RE2::GlobalReplace(&all, t->regexp, t->rewrite), t->greplace_count)
      << "Got: " << all;
    CHECK_EQ(all, t->global);
  }
}